

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::traverse_all_reachable_opcodes
          (Compiler *this,SPIRBlock *block,OpcodeHandler *handler)

{
  ushort uVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  uint32_t *puVar5;
  SPIRFunction *pSVar6;
  long lVar7;
  Instruction *i;
  Instruction *instr;
  
  (*handler->_vptr_OpcodeHandler[5])(handler);
  (*handler->_vptr_OpcodeHandler[6])(handler,block);
  sVar2 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  if (sVar2 != 0) {
    instr = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
    lVar7 = sVar2 * 0xc;
    do {
      puVar5 = stream(this,instr);
      uVar1 = instr->op;
      iVar4 = (*handler->_vptr_OpcodeHandler[2])(handler,(ulong)uVar1,puVar5,(ulong)instr->length);
      if ((char)iVar4 == '\0') {
        return false;
      }
      if (uVar1 == 0x39) {
        pSVar6 = Variant::get<spirv_cross::SPIRFunction>
                           ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + puVar5[2]);
        iVar4 = (*handler->_vptr_OpcodeHandler[4])(handler,pSVar6);
        if ((char)iVar4 != '\0') {
          iVar4 = (*handler->_vptr_OpcodeHandler[7])(handler,puVar5,(ulong)instr->length);
          if ((char)iVar4 == '\0') {
            return false;
          }
          pSVar6 = Variant::get<spirv_cross::SPIRFunction>
                             ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + puVar5[2])
          ;
          bVar3 = traverse_all_reachable_opcodes(this,pSVar6,handler);
          if (!bVar3) {
            return false;
          }
          iVar4 = (*handler->_vptr_OpcodeHandler[8])(handler,puVar5,(ulong)instr->length);
          if ((char)iVar4 == '\0') {
            return false;
          }
          (*handler->_vptr_OpcodeHandler[6])(handler,block);
        }
      }
      instr = instr + 1;
      lVar7 = lVar7 + -0xc;
    } while (lVar7 != 0);
  }
  iVar4 = (*handler->_vptr_OpcodeHandler[3])(handler,block);
  return SUB41(iVar4,0);
}

Assistant:

bool Compiler::traverse_all_reachable_opcodes(const SPIRBlock &block, OpcodeHandler &handler) const
{
	handler.set_current_block(block);
	handler.rearm_current_block(block);

	// Ideally, perhaps traverse the CFG instead of all blocks in order to eliminate dead blocks,
	// but this shouldn't be a problem in practice unless the SPIR-V is doing insane things like recursing
	// inside dead blocks ...
	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		if (!handler.handle(op, ops, i.length))
			return false;

		if (op == OpFunctionCall)
		{
			auto &func = get<SPIRFunction>(ops[2]);
			if (handler.follow_function_call(func))
			{
				if (!handler.begin_function_scope(ops, i.length))
					return false;
				if (!traverse_all_reachable_opcodes(get<SPIRFunction>(ops[2]), handler))
					return false;
				if (!handler.end_function_scope(ops, i.length))
					return false;

				handler.rearm_current_block(block);
			}
		}
	}

	if (!handler.handle_terminator(block))
		return false;

	return true;
}